

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O3

void __thiscall despot::EvalLog::SetInitialBudget(EvalLog *this,string *instance)

{
  pointer piVar1;
  pointer pcVar2;
  ostream *this_00;
  long *plVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  string local_90;
  string local_70;
  string local_50;
  
  curr_inst_budget = 0.0;
  piVar1 = (this->num_of_completed_runs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar4 = (long)(this->num_of_completed_runs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar1;
  if (lVar4 != 0) {
    lVar4 = lVar4 >> 2;
    lVar5 = 0;
    iVar6 = 0;
    do {
      iVar6 = iVar6 + piVar1[lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar4 + (ulong)(lVar4 == 0) != lVar5);
    if (iVar6 == 0x960) {
      curr_inst_budget = 0.0;
      return;
    }
  }
  pcVar2 = (instance->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,pcVar2 + instance->_M_string_length);
  iVar6 = GetNumRemainingRuns(this,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (iVar6 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Num of remaining runs: curr / total = ",0x26);
    pcVar2 = (instance->_M_dataplus)._M_p;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar2,pcVar2 + instance->_M_string_length);
    iVar6 = GetNumRemainingRuns(this,&local_70);
    this_00 = (ostream *)std::ostream::operator<<(&std::cout,iVar6);
    std::__ostream_insert<char,std::char_traits<char>>(this_00," / ",3);
    piVar1 = (this->num_of_completed_runs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar4 = (long)(this->num_of_completed_runs).super__Vector_base<int,_std::allocator<int>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)piVar1;
    if (lVar4 == 0) {
      iVar6 = 0x960;
    }
    else {
      lVar4 = lVar4 >> 2;
      lVar5 = 0;
      iVar6 = 0;
      do {
        iVar6 = iVar6 + piVar1[lVar5];
        lVar5 = lVar5 + 1;
      } while (lVar4 + (ulong)(lVar4 == 0) != lVar5);
      iVar6 = 0x960 - iVar6;
    }
    plVar3 = (long *)std::ostream::operator<<(this_00,iVar6);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    dVar9 = curr_inst_start_time;
    lVar4 = start_time;
    piVar1 = (this->num_of_completed_runs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar5 = (long)(this->num_of_completed_runs).super__Vector_base<int,_std::allocator<int>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)piVar1;
    if (lVar5 == 0) {
      dVar8 = 2400.0;
    }
    else {
      lVar5 = lVar5 >> 2;
      lVar7 = 0;
      iVar6 = 0;
      do {
        iVar6 = iVar6 + piVar1[lVar7];
        lVar7 = lVar7 + 1;
      } while (lVar5 + (ulong)(lVar5 == 0) != lVar7);
      dVar8 = (double)(0x960 - iVar6);
    }
    pcVar2 = (instance->_M_dataplus)._M_p;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,pcVar2,pcVar2 + instance->_M_string_length);
    iVar6 = GetNumRemainingRuns(this,&local_90);
    curr_inst_budget = (double)iVar6 * ((((double)lVar4 - dVar9) + 86400.0) / dVar8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    dVar9 = 0.0;
    if ((curr_inst_budget < 0.0) || (dVar9 = 1080.0, 1080.0 < curr_inst_budget)) {
      curr_inst_budget = dVar9;
    }
  }
  return;
}

Assistant:

void EvalLog::SetInitialBudget(string instance) {
	curr_inst_budget = 0;
	if (GetNumRemainingRuns() != 0 && GetNumRemainingRuns(instance) != 0) {
		cout << "Num of remaining runs: curr / total = "
				<< GetNumRemainingRuns(instance) << " / "
				<< GetNumRemainingRuns() << endl;
		curr_inst_budget = (24 * 3600 - (curr_inst_start_time - start_time))
				/ GetNumRemainingRuns() * GetNumRemainingRuns(instance);
		if (curr_inst_budget < 0)
			curr_inst_budget = 0;
		if (curr_inst_budget > 18 * 60)
			curr_inst_budget = 18 * 60;
	}
}